

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O3

void __thiscall Psbt_UsecaseMultisig_Test::TestBody(Psbt_UsecaseMultisig_Test *this)

{
  AssertHelperData *pAVar1;
  undefined8 uVar2;
  bool bVar3;
  pointer pSVar4;
  long lVar5;
  ulong uVar6;
  _func_int *message;
  char *pcVar7;
  pointer puVar8;
  Amount *value;
  size_t sVar9;
  Amount AVar10;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::KeyData> __l_01;
  initializer_list<cfd::core::ByteData> __l_02;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_1;
  ByteData256 sighash;
  AssertionResult gtest_ar_4;
  SigHashType sighash_type;
  ByteData sig1;
  Psbt psbt2;
  string path1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> wsh_script;
  ByteData sig2;
  AssertionResult gtest_ar_10;
  Psbt psbt;
  HDWallet wallet2;
  HDWallet wallet1;
  string in_path;
  Psbt psbt1;
  Amount amount;
  Script multisig;
  TxIn txin;
  Transaction utxo_tx;
  Script out_multisig;
  Address addr;
  KeyData key_in2;
  KeyData key_in1;
  KeyData key2;
  KeyData key1;
  undefined1 local_df8 [16];
  undefined1 local_de8 [40];
  undefined1 local_dc0 [16];
  _func_int *local_db0;
  undefined1 local_da8 [72];
  string local_d60;
  Transaction local_d40;
  undefined1 local_d00 [32];
  AssertHelperData *pAStack_ce0;
  pointer local_cd8;
  undefined1 local_cc8 [24];
  Script local_cb0;
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  local_c78;
  string local_c48;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_c28;
  undefined1 local_c10 [24];
  internal local_bf8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf0;
  Psbt local_be8;
  HDWallet local_b68;
  HDWallet local_b50;
  string local_b38;
  ByteData local_b18;
  ByteData local_b00;
  SigHashType local_ae4;
  undefined1 local_ad8 [336];
  KeyData local_988;
  Amount local_838;
  Script local_828;
  AbstractTxIn local_7f0;
  Transaction local_760;
  Script local_720;
  undefined1 local_6e8 [48];
  pointer local_6b8;
  pointer local_6a0;
  pointer local_688;
  TapBranch local_670;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_5f8;
  Script local_5e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5a0;
  KeyData local_570;
  KeyData local_420;
  KeyData local_2d0;
  KeyData local_180;
  
  cfd::Psbt::Psbt(&local_be8);
  cfd::core::ByteData::ByteData((ByteData *)local_ad8,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_b50,(ByteData *)local_ad8);
  if ((long *)local_ad8._0_8_ != (long *)0x0) {
    operator_delete((void *)local_ad8._0_8_);
  }
  cfd::core::ByteData::ByteData((ByteData *)local_ad8,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_b68,(ByteData *)local_ad8);
  if ((long *)local_ad8._0_8_ != (long *)0x0) {
    operator_delete((void *)local_ad8._0_8_);
  }
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c48,"44h/0h/0h/0/12","");
  cfd::core::HDWallet::GeneratePubkeyData(&local_180,&local_b50,kTestnet,&local_c48);
  cfd::core::HDWallet::GeneratePubkeyData(&local_2d0,&local_b68,kTestnet,&local_c48);
  cfd::core::KeyData::GetPubkey((Pubkey *)local_ad8,&local_180);
  cfd::core::KeyData::GetPubkey((Pubkey *)(local_ad8 + 0x18),&local_2d0);
  __l._M_len = 2;
  __l._M_array = (iterator)local_ad8;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_6e8,__l,
             (allocator_type *)&local_420);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_720,2,(vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_6e8
             ,true);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_6e8);
  lVar5 = 0x18;
  do {
    if (*(void **)(local_ad8 + lVar5) != (void *)0x0) {
      operator_delete(*(void **)(local_ad8 + lVar5));
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  cfd::core::Address::Address((Address *)local_6e8,kCfdIllegalArgumentError,kVersion0,&local_720);
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b38,"44h/0h/0h/0/11","");
  cfd::core::HDWallet::GeneratePrivkeyData(&local_420,&local_b50,kTestnet,&local_b38);
  cfd::core::HDWallet::GeneratePrivkeyData(&local_570,&local_b68,kTestnet,&local_b38);
  cfd::core::KeyData::GetPubkey((Pubkey *)local_ad8,&local_420);
  cfd::core::KeyData::GetPubkey((Pubkey *)(local_ad8 + 0x18),&local_570);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_ad8;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_7f0,__l_00,
             (allocator_type *)local_cc8);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_828,2,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_7f0,true);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_7f0);
  lVar5 = 0x18;
  do {
    if (*(void **)(local_ad8 + lVar5) != (void *)0x0) {
      operator_delete(*(void **)(local_ad8 + lVar5));
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_ad8,&local_828);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_7f0,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"multisig.GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,(char *)local_ad8._0_8_);
  if ((undefined1 *)local_ad8._0_8_ != local_ad8 + 0x10) {
    operator_delete((void *)local_ad8._0_8_);
  }
  if ((char)local_7f0._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)local_ad8);
    if (local_7f0.txid_._vptr_Txid == (_func_int **)0x0) {
      message = (_func_int *)0x6169ca;
    }
    else {
      message = *local_7f0.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x455,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_cc8,(Message *)local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_cc8);
    if ((long *)local_ad8._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_ad8._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_ad8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7f0.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::Transaction::Transaction(&local_760,&g_psbt_utxo_sh_wsh_multi_abi_cxx11_);
  pAVar1 = (AssertHelperData *)(local_cc8 + 0x10);
  local_cc8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc8,"544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",
             "");
  cfd::core::Txid::Txid((Txid *)local_ad8,(string *)local_cc8);
  cfd::core::TxIn::TxIn((TxIn *)&local_7f0,(Txid *)local_ad8,0,0xffffffff);
  local_ad8._0_8_ = &PTR__Txid_00723450;
  if ((pointer)local_ad8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_ad8._8_8_);
  }
  if ((AssertHelperData *)local_cc8._0_8_ != pAVar1) {
    operator_delete((void *)local_cc8._0_8_);
  }
  cfd::core::Psbt::AddTxIn(&local_be8.super_Psbt,(TxIn *)&local_7f0);
  cfd::core::Transaction::GetTxOut((TxOutReference *)local_cc8,&local_760,0);
  cfd::core::KeyData::KeyData((KeyData *)local_ad8);
  cfd::core::Psbt::SetTxInUtxo
            (&local_be8.super_Psbt,0,(TxOutReference *)local_cc8,&local_828,(KeyData *)local_ad8);
  cfd::core::KeyData::~KeyData((KeyData *)local_ad8);
  local_cc8._0_8_ = &PTR__AbstractTxOutReference_00723740;
  cfd::core::Script::~Script(&local_cb0);
  cfd::core::SigHashType::SigHashType((SigHashType *)local_ad8);
  cfd::core::Psbt::SetTxInSighashType(&local_be8.super_Psbt,0,(SigHashType *)local_ad8);
  cfd::core::Psbt::GetTxInRedeemScriptDirect((Script *)local_ad8,&local_be8.super_Psbt,0,true,true);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_cc8,(Script *)local_ad8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_dc0,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,(char *)local_cc8._0_8_);
  if ((AssertHelperData *)local_cc8._0_8_ != pAVar1) {
    operator_delete((void *)local_cc8._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_ad8);
  if ((internal)local_dc0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_ad8);
    if ((pointer)local_dc0._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_dc0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x45f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_cc8,(Message *)local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_cc8);
    if ((undefined **)local_ad8._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_ad8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_ad8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_dc0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::GetTxInRedeemScriptDirect((Script *)local_ad8,&local_be8.super_Psbt,0,true,false)
  ;
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_cc8,(Script *)local_ad8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_dc0,
             "\"00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9\"",
             "psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str()",
             "00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",
             (char *)local_cc8._0_8_);
  if ((AssertHelperData *)local_cc8._0_8_ != pAVar1) {
    operator_delete((void *)local_cc8._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_ad8);
  if ((internal)local_dc0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_ad8);
    if ((pointer)local_dc0._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_dc0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x461,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_cc8,(Message *)local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_cc8);
    if ((undefined **)local_ad8._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_ad8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_ad8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_dc0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Amount::Amount(&local_838,0x1dcd4b10);
  cfd::core::Address::GetLockingScript((Script *)local_ad8,(Address *)local_6e8);
  cfd::core::Psbt::AddTxOut(&local_be8.super_Psbt,(Script *)local_ad8,&local_838);
  cfd::core::Script::~Script((Script *)local_ad8);
  cfd::core::KeyData::KeyData((KeyData *)local_ad8,&local_180);
  cfd::core::KeyData::KeyData(&local_988,&local_2d0);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_ad8;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_cc8,__l_01,
             (allocator_type *)local_dc0);
  cfd::core::Psbt::SetTxOutData
            (&local_be8.super_Psbt,0,&local_720,
             (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_cc8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_cc8);
  lVar5 = 0x150;
  do {
    cfd::core::KeyData::~KeyData((KeyData *)(local_ad8 + lVar5));
    lVar5 = lVar5 + -0x150;
  } while (lVar5 != -0x150);
  cfd::Psbt::Psbt((Psbt *)local_ad8);
  cfd::core::Psbt::AddTxIn((Psbt *)local_ad8,(TxIn *)&local_7f0);
  cfd::core::Transaction::GetTxOut((TxOutReference *)local_cc8,&local_760,0);
  cfd::core::Psbt::SetTxInUtxo
            ((Psbt *)local_ad8,0,(TxOutReference *)local_cc8,&local_828,&local_420);
  local_cc8._0_8_ = &PTR__AbstractTxOutReference_00723740;
  cfd::core::Script::~Script(&local_cb0);
  cfd::Psbt::Psbt((Psbt *)local_cc8);
  cfd::core::Psbt::AddTxIn((Psbt *)local_cc8,(TxIn *)&local_7f0);
  cfd::core::Transaction::GetTxOut((TxOutReference *)local_dc0,&local_760,0);
  cfd::core::Psbt::SetTxInUtxo
            ((Psbt *)local_cc8,0,(TxOutReference *)local_dc0,&local_828,&local_570);
  local_dc0._0_8_ = &PTR__AbstractTxOutReference_00723740;
  cfd::core::Script::~Script((Script *)local_da8);
  cfd::core::Psbt::Join(&local_be8.super_Psbt,(Psbt *)local_ad8,false);
  cfd::core::Psbt::Join(&local_be8.super_Psbt,(Psbt *)local_cc8,false);
  cfd::core::Psbt::GetData((ByteData *)&local_d40,&local_be8.super_Psbt);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_dc0,(ByteData *)&local_d40);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_df8,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,(char *)local_dc0._0_8_);
  if ((_func_int **)local_dc0._0_8_ != &local_db0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  if ((void *)CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction._1_7_,
                       (char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction.
                                     _1_7_,(char)local_d40.super_AbstractTransaction.
                                                 _vptr_AbstractTransaction));
  }
  if (local_df8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_dc0);
    if ((AssertHelperData *)local_df8._8_8_ == (AssertHelperData *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)(Type *)local_df8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x485,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d40,(Message *)local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d40);
    if ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_dc0,&local_be8.super_Psbt);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d40,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA="
             ,(char *)local_dc0._0_8_);
  if ((_func_int **)local_dc0._0_8_ != &local_db0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  if ((char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)local_dc0);
    if ((undefined8 *)local_d40.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_d40.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_df8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x486,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_df8,(Message *)local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_df8);
    if ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d40.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::Psbt::operator=((Psbt *)local_ad8,&local_be8);
  cfd::core::KeyData::GetPrivkey((Privkey *)local_dc0,&local_420);
  cfd::core::Psbt::Sign((Psbt *)local_ad8,(Privkey *)local_dc0,true);
  if ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  cfd::Psbt::operator=((Psbt *)local_cc8,&local_be8);
  cfd::core::Psbt::GetTxInSighashType((Psbt *)local_d00,(uint32_t)&local_be8);
  cfd::core::Psbt::GetTxInUtxo((TxOut *)local_dc0,&local_be8.super_Psbt,0,false,(bool *)0x0);
  cfd::core::Psbt::GetTransaction(&local_d40,&local_be8.super_Psbt);
  cfd::core::Psbt::GetTxInRedeemScript
            ((Script *)local_df8,&local_be8.super_Psbt,0,false,(bool *)0x0);
  cfd::core::Script::GetData((ByteData *)(local_d00 + 0x18),(Script *)local_df8);
  cfd::core::SigHashType::SigHashType(&local_ae4,(SigHashType *)local_d00);
  AVar10 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)local_dc0);
  local_c10._0_8_ = AVar10.amount_;
  value = (Amount *)local_c10;
  local_c10[8] = AVar10.ignore_check_;
  cfd::core::Transaction::GetSignatureHash
            ((ByteData256 *)&local_d60,&local_d40,0,(ByteData *)(local_d00 + 0x18),&local_ae4,value,
             kVersion0);
  if ((void *)local_d00._24_8_ != (void *)0x0) {
    operator_delete((void *)local_d00._24_8_);
  }
  cfd::core::Script::~Script((Script *)local_df8);
  cfd::core::KeyData::GetPrivkey((Privkey *)local_df8,&local_570);
  cfd::core::Privkey::CalculateEcSignature
            ((ByteData *)(local_d00 + 0x18),(Privkey *)local_df8,(ByteData256 *)&local_d60,true);
  if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_df8._0_8_);
  }
  cfd::core::CryptoUtil::ConvertSignatureToDer
            ((ByteData *)local_df8,(ByteData *)(local_d00 + 0x18),(SigHashType *)local_d00);
  uVar2 = local_d00._24_8_;
  local_d00._24_8_ = local_df8._0_8_;
  pAStack_ce0 = (AssertHelperData *)local_df8._8_8_;
  local_cd8 = (pointer)local_de8._0_8_;
  local_df8._0_8_ = (AssertHelperData *)0x0;
  local_df8._8_8_ = (pointer)0x0;
  local_de8._0_8_ = (pointer)0x0;
  if ((void *)uVar2 != (void *)0x0) {
    operator_delete((void *)uVar2);
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
      operator_delete((void *)local_df8._0_8_);
    }
  }
  cfd::core::Psbt::SetTxInSignature((Psbt *)local_cc8,0,&local_570,(ByteData *)(local_d00 + 0x18));
  if ((AssertHelperData *)local_d00._24_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_d00._24_8_);
  }
  if ((void *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,
                                     local_d60._M_dataplus._M_p._0_4_));
  }
  cfd::core::Transaction::~Transaction(&local_d40);
  local_dc0._0_8_ = &PTR__AbstractTxOut_0072e7f0;
  cfd::core::Script::~Script((Script *)local_da8);
  cfd::core::Psbt::Combine(&local_be8.super_Psbt,(Psbt *)local_ad8);
  cfd::core::Psbt::Combine(&local_be8.super_Psbt,(Psbt *)local_cc8);
  cfd::core::Psbt::GetData((ByteData *)&local_d40,&local_be8.super_Psbt);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_dc0,(ByteData *)&local_d40);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_df8,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,(char *)local_dc0._0_8_);
  if ((_func_int **)local_dc0._0_8_ != &local_db0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  if ((void *)CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction._1_7_,
                       (char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction.
                                     _1_7_,(char)local_d40.super_AbstractTransaction.
                                                 _vptr_AbstractTransaction));
  }
  if (local_df8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_dc0);
    if ((pointer)local_df8._8_8_ == (pointer)0x0) {
      puVar8 = "";
    }
    else {
      puVar8 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_df8._8_8_)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4a8,(char *)puVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d40,(Message *)local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d40);
    if ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_dc0,&local_be8.super_Psbt);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d40,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA"
             ,(char *)local_dc0._0_8_);
  if ((_func_int **)local_dc0._0_8_ != &local_db0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  if ((char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)local_dc0);
    if ((undefined8 *)local_d40.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_d40.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_df8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4a9,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_df8,(Message *)local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_df8);
    if ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d40.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::KeyData::GetPubkey((Pubkey *)local_dc0,&local_420);
  cfd::core::Psbt::GetTxInSignature
            ((ByteData *)(local_d00 + 0x18),&local_be8.super_Psbt,0,(Pubkey *)local_dc0);
  if ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  cfd::core::KeyData::GetPubkey((Pubkey *)local_dc0,&local_570);
  cfd::core::Psbt::GetTxInSignature
            ((ByteData *)local_c10,&local_be8.super_Psbt,0,(Pubkey *)local_dc0);
  if ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  cfd::core::Psbt::GetTxInRedeemScript
            ((Script *)&local_d40,&local_be8.super_Psbt,0,false,(bool *)0x0);
  bVar3 = cfd::core::Psbt::IsFinalizedInput(&local_be8.super_Psbt,0);
  local_df8._8_8_ = (pointer)0x0;
  local_df8[0] = (internal)!bVar3;
  if (bVar3) {
    testing::Message::Message((Message *)&local_d60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_dc0,(internal *)local_df8,
               (AssertionResult *)"psbt.IsFinalizedInput(0)","true","false",(char *)value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4b3,(char *)local_dc0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d00,(Message *)&local_d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d00);
    if ((_func_int **)local_dc0._0_8_ != &local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if (CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,
                                       local_d60._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar3 = cfd::core::Psbt::IsFinalized(&local_be8.super_Psbt);
  local_df8[0] = (internal)!bVar3;
  local_df8._8_8_ = (pointer)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_d60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_dc0,(internal *)local_df8,(AssertionResult *)"psbt.IsFinalized()",
               "true","false",(char *)value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4b4,(char *)local_dc0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d00,(Message *)&local_d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d00);
    if ((_func_int **)local_dc0._0_8_ != &local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if (CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,
                                       local_d60._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ByteData::ByteData((ByteData *)local_dc0);
  local_da8._0_8_ = (_func_int **)0x0;
  local_da8._8_8_ = (pointer)0x0;
  local_da8._16_8_ = (pointer)0x0;
  uVar6 = (long)pAStack_ce0 - local_d00._24_8_;
  if (uVar6 == 0) {
    pSVar4 = (pointer)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pSVar4 = (pointer)operator_new(uVar6);
    sVar9 = (long)pAStack_ce0 - local_d00._24_8_;
  }
  local_da8._16_8_ = uVar6 + (long)pSVar4;
  local_da8._0_8_ = pSVar4;
  if (pAStack_ce0 != (AssertHelperData *)local_d00._24_8_) {
    local_da8._8_8_ = pSVar4;
    memmove(pSVar4,(void *)local_d00._24_8_,sVar9);
  }
  local_da8._8_8_ = (long)&pSVar4->_vptr_ScriptElement + sVar9;
  puVar8 = (pointer)CONCAT71(local_c10._9_7_,local_c10[8]);
  local_da8._24_8_ = (pointer)0x0;
  local_da8._32_8_ = (pointer)0x0;
  local_da8._40_8_ = (pointer)0x0;
  uVar6 = (long)puVar8 - local_c10._0_8_;
  if (uVar6 == 0) {
    pSVar4 = (pointer)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pSVar4 = (pointer)operator_new(uVar6);
    puVar8 = (pointer)CONCAT71(local_c10._9_7_,local_c10[8]);
    sVar9 = (long)puVar8 - local_c10._0_8_;
  }
  local_da8._40_8_ = uVar6 + (long)pSVar4;
  local_da8._24_8_ = pSVar4;
  if (puVar8 != (pointer)local_c10._0_8_) {
    local_da8._32_8_ = pSVar4;
    memmove(pSVar4,(void *)local_c10._0_8_,sVar9);
  }
  local_da8._32_8_ = (long)&pSVar4->_vptr_ScriptElement + sVar9;
  cfd::core::Script::GetData((ByteData *)(local_da8 + 0x30),(Script *)&local_d40);
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)local_dc0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_df8,__l_02,
             (allocator_type *)&local_d60);
  cfd::core::Psbt::SetTxInFinalScript
            (&local_be8.super_Psbt,0,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_df8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_df8);
  lVar5 = 0x48;
  do {
    if (*(void **)(local_dc0 + lVar5) != (void *)0x0) {
      operator_delete(*(void **)(local_dc0 + lVar5));
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  bVar3 = cfd::core::Psbt::IsFinalizedInput(&local_be8.super_Psbt,0);
  local_df8[0] = (internal)bVar3;
  local_df8._8_8_ = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_d60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_dc0,(internal *)local_df8,
               (AssertionResult *)"psbt.IsFinalizedInput(0)","false","true",(char *)value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4b8,(char *)local_dc0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d00,(Message *)&local_d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d00);
    if ((_func_int **)local_dc0._0_8_ != &local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if (CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,
                                       local_d60._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::ClearTxInSignData(&local_be8.super_Psbt,0);
  cfd::core::Psbt::GetTxInFinalScript
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_d00,
             &local_be8.super_Psbt,0,true);
  cfd::core::Psbt::GetTxInFinalScript(&local_c28,&local_be8.super_Psbt,0,false);
  local_d60._M_dataplus._M_p._0_4_ = 4;
  local_df8._0_8_ = ((long)(local_d00._8_8_ - local_d00._0_8_) >> 3) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_dc0,"4","wit_script.size()",(int *)&local_d60,
             (unsigned_long *)local_df8);
  if ((internal)local_dc0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_df8);
    if ((pointer)local_dc0._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_dc0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4bd,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)local_df8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_df8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_dc0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_d00._8_8_ - local_d00._0_8_ == 0x60) {
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_dc0,(Script *)&local_d40);
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)local_df8,(ByteData *)&((AssertHelperData *)(local_d00._0_8_ + 0x38))->line
              );
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_d60,"script.GetHex()","wit_script[3].GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_df8);
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)local_de8) {
      operator_delete((void *)local_df8._0_8_);
    }
    if ((_func_int **)local_dc0._0_8_ != &local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if ((char)local_d60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)local_dc0);
      if ((undefined8 *)local_d60._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_df8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
                 ,0x4bf,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_df8,(Message *)local_dc0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_df8);
      if ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((_func_int **)local_dc0._0_8_ != (_func_int **)0x0)) {
          (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_d60._M_dataplus._M_p._0_4_ = 1;
  local_df8._0_8_ =
       ((long)local_c28.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_c28.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_dc0,"1","wsh_script.size()",(int *)&local_d60,
             (unsigned_long *)local_df8);
  if ((internal)local_dc0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_df8);
    if ((pointer)local_dc0._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_dc0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4c1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)local_df8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_df8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_dc0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((long)local_c28.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_c28.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x18) {
    cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)local_dc0,(Script *)&local_d40);
    cfd::core::Script::GetData(&local_b18,(Script *)local_dc0);
    cfd::core::ByteData::Serialize(&local_b00,&local_b18);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_df8,&local_b00);
    cfd::core::ByteData::GetHex_abi_cxx11_
              (&local_d60,
               local_c28.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              (local_bf8,"exp_script.GetData().Serialize().GetHex()","wsh_script[0].GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_df8,
               &local_d60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
        &local_d60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_));
    }
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)local_de8) {
      operator_delete((void *)local_df8._0_8_);
    }
    if (local_b00.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b00.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b18.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b18.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_bf8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_df8);
      if (local_bf0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_bf0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
                 ,0x4c4,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)local_df8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
      if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_df8._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_bf0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Script::~Script((Script *)local_dc0);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_c28);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_d00);
  cfd::core::Script::~Script((Script *)&local_d40);
  if ((pointer)local_c10._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c10._0_8_);
  }
  if ((AssertHelperData *)local_d00._24_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_d00._24_8_);
  }
  local_d40.super_AbstractTransaction._vptr_AbstractTransaction._0_1_ =
       cfd::core::Psbt::IsFinalized(&local_be8.super_Psbt);
  local_d40.super_AbstractTransaction.wally_tx_pointer_ = (void *)0x0;
  if (!(bool)(char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction) {
    testing::Message::Message((Message *)local_df8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_dc0,(internal *)&local_d40,(AssertionResult *)"psbt.IsFinalized()",
               "false","true",(char *)value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4cc,(char *)local_dc0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)local_df8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
    if ((_func_int **)local_dc0._0_8_ != &local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_df8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d40.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::ExtractTransaction((Transaction *)local_dc0,&local_be8.super_Psbt);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_d40,(AbstractTransaction *)local_dc0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_df8,
             "\"02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000\""
             ,"tx.GetHex().c_str()",
             "02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000"
             ,(char *)CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction._1_7_,
                               (char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction))
  ;
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction._1_7_,
               (char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction) !=
      &local_d40.vin_) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction._1_7_,
                             (char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction));
  }
  if (local_df8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d40);
    if ((pointer)local_df8._8_8_ == (pointer)0x0) {
      puVar8 = "";
    }
    else {
      puVar8 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_df8._8_8_)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4ce,(char *)puVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)&local_d40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
    if (CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction._1_7_,
                 (char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction._1_7_,
                           (char)local_d40.super_AbstractTransaction._vptr_AbstractTransaction) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_d40.super_AbstractTransaction._vptr_AbstractTransaction
                                       ._1_7_,(char)local_d40.super_AbstractTransaction.
                                                    _vptr_AbstractTransaction) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Transaction::~Transaction((Transaction *)local_dc0);
  local_cc8._0_8_ = &PTR__Psbt_00727790;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(&local_c78);
  cfd::core::Psbt::~Psbt((Psbt *)local_cc8);
  local_ad8._0_8_ = &PTR__Psbt_00727790;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree((_Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
               *)(local_ad8 + 0x50));
  cfd::core::Psbt::~Psbt((Psbt *)local_ad8);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_7f0);
  cfd::core::Transaction::~Transaction(&local_760);
  cfd::core::Script::~Script(&local_828);
  cfd::core::KeyData::~KeyData(&local_570);
  cfd::core::KeyData::~KeyData(&local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_5a0);
  cfd::core::Script::~Script(&local_5e0);
  local_670._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_5f8);
  cfd::core::TapBranch::~TapBranch(&local_670);
  if (local_688 != (pointer)0x0) {
    operator_delete(local_688);
  }
  if (local_6a0 != (pointer)0x0) {
    operator_delete(local_6a0);
  }
  if (local_6b8 != (pointer)0x0) {
    operator_delete(local_6b8);
  }
  if ((pointer)local_6e8._16_8_ != (pointer)(local_6e8 + 0x20)) {
    operator_delete((void *)local_6e8._16_8_);
  }
  cfd::core::Script::~Script(&local_720);
  cfd::core::KeyData::~KeyData(&local_2d0);
  cfd::core::KeyData::~KeyData(&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  if (local_b68.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b68.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b50.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b50.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_be8.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00727790;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(&local_be8.verify_ignore_map_._M_t);
  cfd::core::Psbt::~Psbt(&local_be8.super_Psbt);
  return;
}

Assistant:

TEST(Psbt, UsecaseMultisig) {
  Psbt psbt;
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/12";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path1);
  auto out_multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key1.GetPubkey(), key2.GetPubkey()});
  auto addr = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_multisig);

  std::string in_path = "44h/0h/0h/0/11";
  auto key_in1 = wallet1.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto key_in2 = wallet2.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key_in1.GetPubkey(), key_in2.GetPubkey()});
  EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae", multisig.GetHex().c_str());

  Transaction utxo_tx(g_psbt_utxo_sh_wsh_multi);
  TxIn txin(Txid("544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"), 0, 0xffffffff);

  try {
    psbt.AddTxIn(txin);
    psbt.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, KeyData());
    psbt.SetTxInSighashType(0, SigHashType());
    EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae",
        psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str());
    EXPECT_STREQ("00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",
        psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Amount amount(499993360);
  try {
    psbt.AddTxOut(addr.GetLockingScript(), amount);
    psbt.SetTxOutData(0, out_multisig, std::vector<KeyData>{key1, key2});
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt1;
  try {
    psbt1.AddTxIn(txin);
    psbt1.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt2;
  try {
    psbt2.AddTxIn(txin);
    psbt2.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Join(psbt1);
    psbt.Join(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt1 = psbt;
    psbt1.Sign(key_in1.GetPrivkey());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt2 = psbt;
    // psbt2.Sign(key_in2.GetPrivkey());
    // Same processing.
    auto sighash_type = psbt.GetTxInSighashType(0);
    auto utxo_txout = psbt.GetTxInUtxo(0);
    auto tx = psbt.GetTransaction();
    auto sighash = tx.GetSignatureHash(0, psbt.GetTxInRedeemScript(0).GetData(),
        sighash_type, utxo_txout.GetValue(), WitnessVersion::kVersion0);
    auto sig = key_in2.GetPrivkey().CalculateEcSignature(sighash);
    sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
    psbt2.SetTxInSignature(0, key_in2, sig);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Combine(psbt1);
    psbt.Combine(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    auto sig1 = psbt.GetTxInSignature(0, key_in1.GetPubkey());
    auto sig2 = psbt.GetTxInSignature(0, key_in2.GetPubkey());
    auto script = psbt.GetTxInRedeemScript(0);
    EXPECT_FALSE(psbt.IsFinalizedInput(0));
    EXPECT_FALSE(psbt.IsFinalized());
    psbt.SetTxInFinalScript(
        0, std::vector<ByteData>{ByteData(), sig1, sig2, script.GetData()});
    // psbt.Finalize();
    EXPECT_TRUE(psbt.IsFinalizedInput(0));
    psbt.ClearTxInSignData(0);

    auto wit_script = psbt.GetTxInFinalScript(0, true);
    auto wsh_script = psbt.GetTxInFinalScript(0, false);
    EXPECT_EQ(4, wit_script.size());
    if (4 == wit_script.size()) {
      EXPECT_EQ(script.GetHex(), wit_script[3].GetHex());
    }
    EXPECT_EQ(1, wsh_script.size());
    if (1 == wsh_script.size()) {
      auto exp_script = ScriptUtil::CreateP2wshLockingScript(script);
      EXPECT_EQ(exp_script.GetData().Serialize().GetHex(), wsh_script[0].GetHex());
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    EXPECT_TRUE(psbt.IsFinalized());
    auto tx = psbt.ExtractTransaction();
    EXPECT_STREQ("02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000", tx.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
}